

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O2

void __thiscall cpp_sgr::sgr::sgr(sgr *this,SGRCode code)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,code);
  std::__cxx11::string::string((string *)this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

sgr(const SGRCode code) : sgr(std::to_string(code)) {}